

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,size_t i)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  float fVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  float fVar45;
  float fVar46;
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar52;
  float fVar53;
  undefined1 auVar51 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  vfloat4 b0;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vfloat4 a0_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vfloat4 a0_3;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  float fVar72;
  vfloat4 b0_1;
  undefined1 auVar73 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar81;
  float fVar82;
  undefined1 auVar80 [16];
  float fVar83;
  vfloat4 a0_1;
  undefined1 auVar84 [16];
  vfloat4 a0;
  undefined1 auVar85 [16];
  
  pBVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  uVar9 = (ulong)uVar1;
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar14 = sVar4 * uVar9;
  uVar10 = (ulong)(uVar1 + 1);
  lVar13 = sVar4 * uVar10;
  pBVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar5 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar11 = sVar4 * uVar9;
  lVar12 = sVar4 * uVar10;
  fVar72 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar18 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar14),
                          ZEXT416((uint)(fVar72 * *(float *)(pcVar3 + lVar14 + 0xc))),0x30);
  auVar17 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar13),
                          ZEXT416((uint)(fVar72 * *(float *)(pcVar3 + lVar13 + 0xc))),0x30);
  auVar49 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar11),
                          ZEXT416((uint)(fVar72 * *(float *)(pcVar5 + lVar11 + 0xc))),0x30);
  auVar15 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar12),
                          ZEXT416((uint)(fVar72 * *(float *)(pcVar5 + lVar12 + 0xc))),0x30);
  auVar57._8_4_ = 0xbeaaaaab;
  auVar57._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar57._12_4_ = 0xbeaaaaab;
  auVar60 = vfnmadd213ps_fma(auVar49,auVar57,auVar18);
  auVar58 = vfmadd213ps_fma(auVar15,auVar57,auVar17);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           normals.items;
  pcVar3 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar6->super_RawBufferView).stride;
  auVar49 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar9);
  auVar15 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar10);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           dnormals.items;
  pcVar3 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar6->super_RawBufferView).stride;
  auVar56 = vfnmadd132ps_fma(*(undefined1 (*) [16])(pcVar3 + uVar9 * sVar4),auVar49,auVar57);
  auVar57 = vfmadd132ps_fma(auVar57,auVar15,*(undefined1 (*) [16])(pcVar3 + sVar4 * uVar10));
  auVar55._0_12_ = ZEXT812(0);
  auVar55._12_4_ = 0;
  auVar44._0_4_ = auVar17._0_4_ * 0.0;
  auVar44._4_4_ = auVar17._4_4_ * 0.0;
  auVar44._8_4_ = auVar17._8_4_ * 0.0;
  auVar44._12_4_ = auVar17._12_4_ * 0.0;
  auVar16 = vfmadd231ps_fma(auVar44,auVar58,auVar55);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar60,auVar16);
  auVar48._0_4_ = auVar18._0_4_ + auVar44._0_4_;
  auVar48._4_4_ = auVar18._4_4_ + auVar44._4_4_;
  auVar48._8_4_ = auVar18._8_4_ + auVar44._8_4_;
  auVar48._12_4_ = auVar18._12_4_ + auVar44._12_4_;
  auVar80._8_4_ = 0x40400000;
  auVar80._0_8_ = 0x4040000040400000;
  auVar80._12_4_ = 0x40400000;
  auVar44 = vfmadd231ps_fma(auVar16,auVar60,auVar80);
  auVar64 = vfnmadd231ps_fma(auVar44,auVar18,auVar80);
  auVar84._0_4_ = auVar15._0_4_ * 0.0;
  auVar84._4_4_ = auVar15._4_4_ * 0.0;
  auVar84._8_4_ = auVar15._8_4_ * 0.0;
  auVar84._12_4_ = auVar15._12_4_ * 0.0;
  auVar16 = vfmadd231ps_fma(auVar84,auVar57,auVar55);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar56,auVar16);
  auVar85._0_4_ = auVar49._0_4_ + auVar44._0_4_;
  auVar85._4_4_ = auVar49._4_4_ + auVar44._4_4_;
  auVar85._8_4_ = auVar49._8_4_ + auVar44._8_4_;
  auVar85._12_4_ = auVar49._12_4_ + auVar44._12_4_;
  auVar44 = vfmadd231ps_fma(auVar16,auVar56,auVar80);
  auVar16 = vfnmadd231ps_fma(auVar44,auVar49,auVar80);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar58,auVar17);
  auVar44 = vfmadd231ps_fma(auVar44,auVar60,auVar55);
  auVar44 = vfmadd231ps_fma(auVar44,auVar18,auVar55);
  auVar51._0_4_ = auVar17._0_4_ * 3.0;
  auVar51._4_4_ = auVar17._4_4_ * 3.0;
  auVar51._8_4_ = auVar17._8_4_ * 3.0;
  auVar51._12_4_ = auVar17._12_4_ * 3.0;
  auVar17 = vfnmadd231ps_fma(auVar51,auVar80,auVar58);
  auVar17 = vfmadd231ps_fma(auVar17,auVar55,auVar60);
  auVar60 = vfnmadd231ps_fma(auVar17,auVar55,auVar18);
  auVar18 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar57,auVar15);
  auVar18 = vfmadd231ps_fma(auVar18,auVar56,auVar55);
  auVar58 = vfmadd231ps_fma(auVar18,auVar49,auVar55);
  auVar68._0_4_ = auVar15._0_4_ * 3.0;
  auVar68._4_4_ = auVar15._4_4_ * 3.0;
  auVar68._8_4_ = auVar15._8_4_ * 3.0;
  auVar68._12_4_ = auVar15._12_4_ * 3.0;
  auVar15 = vfnmadd231ps_fma(auVar68,auVar80,auVar57);
  auVar15 = vfmadd231ps_fma(auVar15,auVar55,auVar56);
  auVar56 = vfnmadd231ps_fma(auVar15,auVar55,auVar49);
  auVar49 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar15 = vshufps_avx(auVar85,auVar85,0xc9);
  fVar43 = auVar64._0_4_;
  auVar66._0_4_ = fVar43 * auVar15._0_4_;
  fVar45 = auVar64._4_4_;
  auVar66._4_4_ = fVar45 * auVar15._4_4_;
  fVar46 = auVar64._8_4_;
  auVar66._8_4_ = fVar46 * auVar15._8_4_;
  fVar47 = auVar64._12_4_;
  auVar66._12_4_ = fVar47 * auVar15._12_4_;
  auVar15 = vfmsub231ps_fma(auVar66,auVar49,auVar85);
  auVar18 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar71._0_4_ = auVar15._0_4_ * fVar43;
  auVar71._4_4_ = auVar15._4_4_ * fVar45;
  auVar71._8_4_ = auVar15._8_4_ * fVar46;
  auVar71._12_4_ = auVar15._12_4_ * fVar47;
  auVar49 = vfmsub231ps_fma(auVar71,auVar49,auVar16);
  auVar17 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar15 = vshufps_avx(auVar58,auVar58,0xc9);
  fVar50 = auVar60._0_4_;
  auVar16._0_4_ = fVar50 * auVar15._0_4_;
  fVar52 = auVar60._4_4_;
  auVar16._4_4_ = fVar52 * auVar15._4_4_;
  fVar53 = auVar60._8_4_;
  auVar16._8_4_ = fVar53 * auVar15._8_4_;
  fVar54 = auVar60._12_4_;
  auVar16._12_4_ = fVar54 * auVar15._12_4_;
  auVar15 = vfmsub231ps_fma(auVar16,auVar49,auVar58);
  auVar57 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar61._0_4_ = fVar50 * auVar15._0_4_;
  auVar61._4_4_ = fVar52 * auVar15._4_4_;
  auVar61._8_4_ = fVar53 * auVar15._8_4_;
  auVar61._12_4_ = fVar54 * auVar15._12_4_;
  auVar49 = vfmsub231ps_fma(auVar61,auVar49,auVar56);
  auVar58 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar73._4_8_ = auVar55._4_8_;
  auVar73._0_4_ = auVar49._0_4_;
  auVar73._12_4_ = 0;
  auVar15 = vrsqrt14ss_avx512f(auVar55,auVar73);
  fVar72 = auVar15._0_4_;
  fVar8 = fVar72 * 1.5 - auVar49._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
  fVar79 = fVar8 * auVar18._0_4_;
  fVar81 = fVar8 * auVar18._4_4_;
  fVar82 = fVar8 * auVar18._8_4_;
  fVar83 = fVar8 * auVar18._12_4_;
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  auVar16 = vbroadcastss_avx512vl(auVar49);
  auVar17 = vmulps_avx512vl(auVar16,auVar17);
  fVar72 = auVar15._0_4_;
  auVar67._0_4_ = fVar72 * auVar18._0_4_;
  auVar67._4_4_ = fVar72 * auVar18._4_4_;
  auVar67._8_4_ = fVar72 * auVar18._8_4_;
  auVar67._12_4_ = fVar72 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar17,auVar67);
  auVar15 = vrcp14ss_avx512f(auVar55,auVar73);
  auVar49 = vfnmadd213ss_fma(auVar49,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar72 = auVar15._0_4_ * auVar49._0_4_;
  auVar49 = vdpps_avx(auVar57,auVar57,0x7f);
  fVar70 = auVar49._0_4_;
  auVar69._4_8_ = auVar55._4_8_;
  auVar69._0_4_ = fVar70;
  auVar69._12_4_ = 0;
  auVar15 = vrsqrt14ss_avx512f(auVar55,auVar69);
  fVar74 = auVar15._0_4_;
  fVar74 = fVar74 * 1.5 - fVar70 * 0.5 * fVar74 * fVar74 * fVar74;
  fVar75 = fVar74 * auVar57._0_4_;
  fVar76 = fVar74 * auVar57._4_4_;
  fVar77 = fVar74 * auVar57._8_4_;
  fVar78 = fVar74 * auVar57._12_4_;
  auVar15 = vdpps_avx(auVar57,auVar58,0x7f);
  auVar62._0_4_ = fVar70 * auVar58._0_4_;
  auVar62._4_4_ = fVar70 * auVar58._4_4_;
  auVar62._8_4_ = fVar70 * auVar58._8_4_;
  auVar62._12_4_ = fVar70 * auVar58._12_4_;
  fVar70 = auVar15._0_4_;
  auVar58._0_4_ = fVar70 * auVar57._0_4_;
  auVar58._4_4_ = fVar70 * auVar57._4_4_;
  auVar58._8_4_ = fVar70 * auVar57._8_4_;
  auVar58._12_4_ = fVar70 * auVar57._12_4_;
  auVar17 = vsubps_avx(auVar62,auVar58);
  auVar15 = vrcp14ss_avx512f(auVar55,auVar69);
  auVar49 = vfnmadd213ss_fma(auVar49,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar70 = auVar49._0_4_ * auVar15._0_4_;
  auVar49 = vshufps_avx(auVar48,auVar48,0xff);
  auVar63._0_4_ = fVar79 * auVar49._0_4_;
  auVar63._4_4_ = fVar81 * auVar49._4_4_;
  auVar63._8_4_ = fVar82 * auVar49._8_4_;
  auVar63._12_4_ = fVar83 * auVar49._12_4_;
  auVar57 = vsubps_avx(auVar48,auVar63);
  auVar15 = vshufps_avx(auVar64,auVar64,0xff);
  auVar59._0_4_ = auVar15._0_4_ * fVar79 + auVar49._0_4_ * fVar8 * fVar72 * auVar18._0_4_;
  auVar59._4_4_ = auVar15._4_4_ * fVar81 + auVar49._4_4_ * fVar8 * fVar72 * auVar18._4_4_;
  auVar59._8_4_ = auVar15._8_4_ * fVar82 + auVar49._8_4_ * fVar8 * fVar72 * auVar18._8_4_;
  auVar59._12_4_ = auVar15._12_4_ * fVar83 + auVar49._12_4_ * fVar8 * fVar72 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar64,auVar59);
  auVar16 = vaddps_avx512vl(auVar48,auVar63);
  auVar49 = vshufps_avx(auVar44,auVar44,0xff);
  auVar64._0_4_ = fVar75 * auVar49._0_4_;
  auVar64._4_4_ = fVar76 * auVar49._4_4_;
  auVar64._8_4_ = fVar77 * auVar49._8_4_;
  auVar64._12_4_ = fVar78 * auVar49._12_4_;
  auVar58 = vsubps_avx(auVar44,auVar64);
  auVar15 = vshufps_avx(auVar60,auVar60,0xff);
  auVar56._0_4_ = auVar15._0_4_ * fVar75 + auVar49._0_4_ * fVar74 * auVar17._0_4_ * fVar70;
  auVar56._4_4_ = auVar15._4_4_ * fVar76 + auVar49._4_4_ * fVar74 * auVar17._4_4_ * fVar70;
  auVar56._8_4_ = auVar15._8_4_ * fVar77 + auVar49._8_4_ * fVar74 * auVar17._8_4_ * fVar70;
  auVar56._12_4_ = auVar15._12_4_ * fVar78 + auVar49._12_4_ * fVar74 * auVar17._12_4_ * fVar70;
  auVar49 = vsubps_avx(auVar60,auVar56);
  auVar15 = vaddps_avx512vl(auVar44,auVar64);
  fVar72 = auVar57._0_4_;
  auVar65._0_4_ = fVar72 + auVar18._0_4_ * 0.33333334;
  auVar65._4_4_ = auVar57._4_4_ + auVar18._4_4_ * 0.33333334;
  auVar65._8_4_ = auVar57._8_4_ + auVar18._8_4_ * 0.33333334;
  auVar65._12_4_ = auVar57._12_4_ + auVar18._12_4_ * 0.33333334;
  auVar60._0_4_ = auVar49._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar49._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar49._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar49._12_4_ * 0.33333334;
  auVar49 = vsubps_avx(auVar58,auVar60);
  auVar18._0_4_ = (fVar43 + auVar59._0_4_) * 0.33333334;
  auVar18._4_4_ = (fVar45 + auVar59._4_4_) * 0.33333334;
  auVar18._8_4_ = (fVar46 + auVar59._8_4_) * 0.33333334;
  auVar18._12_4_ = (fVar47 + auVar59._12_4_) * 0.33333334;
  auVar18 = vaddps_avx512vl(auVar16,auVar18);
  auVar17._0_4_ = (fVar50 + auVar56._0_4_) * 0.33333334;
  auVar17._4_4_ = (fVar52 + auVar56._4_4_) * 0.33333334;
  auVar17._8_4_ = (fVar53 + auVar56._8_4_) * 0.33333334;
  auVar17._12_4_ = (fVar54 + auVar56._12_4_) * 0.33333334;
  auVar17 = vsubps_avx512vl(auVar15,auVar17);
  auVar38._8_4_ = 1;
  auVar38._0_8_ = 0x100000001;
  auVar38._12_4_ = 1;
  auVar38._16_4_ = 1;
  auVar38._20_4_ = 1;
  auVar38._24_4_ = 1;
  auVar38._28_4_ = 1;
  auVar33._4_4_ = fVar72;
  auVar33._0_4_ = fVar72;
  auVar33._8_4_ = fVar72;
  auVar33._12_4_ = fVar72;
  auVar33._16_4_ = fVar72;
  auVar33._20_4_ = fVar72;
  auVar33._24_4_ = fVar72;
  auVar33._28_4_ = fVar72;
  auVar31 = vpermps_avx2(auVar38,ZEXT1632(auVar57));
  auVar39._8_4_ = 2;
  auVar39._0_8_ = 0x200000002;
  auVar39._12_4_ = 2;
  auVar39._16_4_ = 2;
  auVar39._20_4_ = 2;
  auVar39._24_4_ = 2;
  auVar39._28_4_ = 2;
  auVar32 = vpermps_avx2(auVar39,ZEXT1632(auVar57));
  auVar19 = vbroadcastss_avx512vl(auVar65);
  auVar20 = vpermps_avx512vl(auVar38,ZEXT1632(auVar65));
  auVar21 = vpermps_avx512vl(auVar39,ZEXT1632(auVar65));
  auVar22 = vbroadcastss_avx512vl(auVar49);
  auVar23 = vpermps_avx512vl(auVar38,ZEXT1632(auVar49));
  auVar24 = vpermps_avx512vl(auVar39,ZEXT1632(auVar49));
  auVar25 = vbroadcastss_avx512vl(auVar58);
  auVar26 = vpermps_avx512vl(auVar38,ZEXT1632(auVar58));
  auVar27 = vpermps_avx512vl(auVar39,ZEXT1632(auVar58));
  auVar28 = vmulps_avx512vl(auVar25,bezier_basis0._3944_32_);
  auVar29 = vmulps_avx512vl(auVar26,bezier_basis0._3944_32_);
  auVar30 = vmulps_avx512vl(auVar27,bezier_basis0._3944_32_);
  auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._2788_32_,auVar22);
  auVar29 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._2788_32_,auVar23);
  auVar30 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._2788_32_,auVar24);
  auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._1632_32_,auVar19);
  auVar29 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._1632_32_,auVar20);
  auVar30 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._1632_32_,auVar21);
  auVar49 = vfmadd231ps_fma(auVar28,bezier_basis0._476_32_,auVar33);
  auVar28 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._476_32_,auVar31);
  auVar29 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._476_32_,auVar32);
  auVar25 = vmulps_avx512vl(auVar25,bezier_basis0._8568_32_);
  auVar26 = vmulps_avx512vl(auVar26,bezier_basis0._8568_32_);
  auVar27 = vmulps_avx512vl(auVar27,bezier_basis0._8568_32_);
  auVar22 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._7412_32_,auVar22);
  auVar23 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._7412_32_,auVar23);
  auVar24 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._7412_32_,auVar24);
  auVar19 = vfmadd231ps_avx512vl(auVar22,bezier_basis0._6256_32_,auVar19);
  auVar20 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._6256_32_,auVar20);
  auVar21 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._6256_32_,auVar21);
  auVar19 = vfmadd231ps_avx512vl(auVar19,bezier_basis0._5100_32_,auVar33);
  auVar31 = vfmadd231ps_avx512vl(auVar20,bezier_basis0._5100_32_,auVar31);
  auVar32 = vfmadd231ps_avx512vl(auVar21,bezier_basis0._5100_32_,auVar32);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar21 = vmulps_avx512vl(auVar19,auVar22);
  auVar23 = vmulps_avx512vl(auVar31,auVar22);
  auVar24 = vmulps_avx512vl(auVar32,auVar22);
  auVar31 = vblendps_avx(auVar21,ZEXT832(0) << 0x20,1);
  auVar32 = vblendps_avx(auVar23,ZEXT832(0) << 0x20,1);
  auVar27 = ZEXT832(0) << 0x20;
  auVar19 = vblendps_avx(auVar24,auVar27,1);
  auVar20 = vsubps_avx(ZEXT1632(auVar49),auVar31);
  auVar25 = vsubps_avx512vl(auVar28,auVar32);
  auVar26 = vsubps_avx512vl(auVar29,auVar19);
  auVar31 = vblendps_avx(auVar21,auVar27,0x80);
  auVar32 = vblendps_avx(auVar23,auVar27,0x80);
  auVar19 = vblendps_avx(auVar24,auVar27,0x80);
  auVar31 = vaddps_avx512vl(ZEXT1632(auVar49),auVar31);
  auVar32 = vaddps_avx512vl(auVar28,auVar32);
  auVar19 = vaddps_avx512vl(auVar29,auVar19);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar21 = vminps_avx512vl(auVar23,ZEXT1632(auVar49));
  auVar24 = vminps_avx512vl(auVar23,auVar28);
  auVar27 = vminps_avx512vl(auVar23,auVar29);
  auVar30 = vminps_avx512vl(auVar20,auVar31);
  auVar21 = vminps_avx(auVar21,auVar30);
  auVar30 = vminps_avx512vl(auVar25,auVar32);
  auVar30 = vminps_avx512vl(auVar24,auVar30);
  auVar24 = vminps_avx512vl(auVar26,auVar19);
  auVar27 = vminps_avx512vl(auVar27,auVar24);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar24 = vmaxps_avx512vl(auVar33,ZEXT1632(auVar49));
  auVar28 = vmaxps_avx512vl(auVar33,auVar28);
  auVar29 = vmaxps_avx512vl(auVar33,auVar29);
  auVar31 = vmaxps_avx512vl(auVar20,auVar31);
  auVar34 = vmaxps_avx512vl(auVar24,auVar31);
  auVar31 = vmaxps_avx512vl(auVar25,auVar32);
  auVar28 = vmaxps_avx512vl(auVar28,auVar31);
  auVar31 = vmaxps_avx(auVar26,auVar19);
  auVar29 = vmaxps_avx512vl(auVar29,auVar31);
  auVar31 = vbroadcastss_avx512vl(auVar16);
  auVar32 = vpermps_avx512vl(auVar38,ZEXT1632(auVar16));
  auVar19 = vpermps_avx512vl(auVar39,ZEXT1632(auVar16));
  auVar20 = vbroadcastss_avx512vl(auVar18);
  auVar24 = vpermps_avx512vl(auVar38,ZEXT1632(auVar18));
  auVar25 = vpermps_avx512vl(auVar39,ZEXT1632(auVar18));
  auVar26 = vbroadcastss_avx512vl(auVar17);
  auVar35 = vpermps_avx512vl(auVar38,ZEXT1632(auVar17));
  auVar36 = vpermps_avx512vl(auVar39,ZEXT1632(auVar17));
  auVar37 = vbroadcastss_avx512vl(auVar15);
  auVar38 = vpermps_avx512vl(auVar38,ZEXT1632(auVar15));
  auVar39 = vpermps_avx512vl(auVar39,ZEXT1632(auVar15));
  auVar40 = vmulps_avx512vl(auVar37,bezier_basis0._3944_32_);
  auVar41 = vmulps_avx512vl(auVar38,bezier_basis0._3944_32_);
  auVar42 = vmulps_avx512vl(auVar39,bezier_basis0._3944_32_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._2788_32_,auVar26);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._2788_32_,auVar35);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar36,bezier_basis0._2788_32_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._1632_32_,auVar20);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._1632_32_,auVar24);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar25,bezier_basis0._1632_32_);
  auVar49 = vfmadd231ps_fma(auVar40,bezier_basis0._476_32_,auVar31);
  auVar15 = vfmadd231ps_fma(auVar41,bezier_basis0._476_32_,auVar32);
  auVar40 = vfmadd231ps_avx512vl(auVar42,auVar19,bezier_basis0._476_32_);
  auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._8568_32_);
  auVar38 = vmulps_avx512vl(auVar38,bezier_basis0._8568_32_);
  auVar39 = vmulps_avx512vl(auVar39,bezier_basis0._8568_32_);
  auVar26 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar26);
  auVar35 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._7412_32_,auVar35);
  auVar36 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._7412_32_,auVar36);
  auVar20 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._6256_32_,auVar20);
  auVar24 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._6256_32_,auVar24);
  auVar25 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._6256_32_,auVar25);
  auVar18 = vfmadd231ps_fma(auVar20,bezier_basis0._5100_32_,auVar31);
  auVar17 = vfmadd231ps_fma(auVar24,bezier_basis0._5100_32_,auVar32);
  auVar31 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._5100_32_,auVar19);
  auVar24 = vmulps_avx512vl(ZEXT1632(auVar18),auVar22);
  auVar35 = vmulps_avx512vl(ZEXT1632(auVar17),auVar22);
  auVar22 = vmulps_avx512vl(auVar31,auVar22);
  auVar36 = ZEXT832(0) << 0x20;
  auVar31 = vblendps_avx(auVar24,auVar36,1);
  auVar32 = vblendps_avx(auVar35,auVar36,1);
  auVar19 = vblendps_avx(auVar22,auVar36,1);
  auVar20 = vsubps_avx(ZEXT1632(auVar49),auVar31);
  auVar25 = vsubps_avx(ZEXT1632(auVar15),auVar32);
  auVar26 = vsubps_avx(auVar40,auVar19);
  auVar31 = vblendps_avx(auVar24,auVar36,0x80);
  auVar32 = vblendps_avx(auVar35,auVar36,0x80);
  auVar19 = vblendps_avx(auVar22,auVar36,0x80);
  auVar35._0_4_ = auVar49._0_4_ + auVar31._0_4_;
  auVar35._4_4_ = auVar49._4_4_ + auVar31._4_4_;
  auVar35._8_4_ = auVar49._8_4_ + auVar31._8_4_;
  auVar35._12_4_ = auVar49._12_4_ + auVar31._12_4_;
  auVar35._16_4_ = auVar31._16_4_ + 0.0;
  auVar35._20_4_ = auVar31._20_4_ + 0.0;
  auVar35._24_4_ = auVar31._24_4_ + 0.0;
  auVar35._28_4_ = auVar31._28_4_ + 0.0;
  auVar36._0_4_ = auVar15._0_4_ + auVar32._0_4_;
  auVar36._4_4_ = auVar15._4_4_ + auVar32._4_4_;
  auVar36._8_4_ = auVar15._8_4_ + auVar32._8_4_;
  auVar36._12_4_ = auVar15._12_4_ + auVar32._12_4_;
  auVar36._16_4_ = auVar32._16_4_ + 0.0;
  auVar36._20_4_ = auVar32._20_4_ + 0.0;
  auVar36._24_4_ = auVar32._24_4_ + 0.0;
  auVar36._28_4_ = auVar32._28_4_ + 0.0;
  auVar37._0_4_ = auVar40._0_4_ + auVar19._0_4_;
  auVar37._4_4_ = auVar40._4_4_ + auVar19._4_4_;
  auVar37._8_4_ = auVar40._8_4_ + auVar19._8_4_;
  auVar37._12_4_ = auVar40._12_4_ + auVar19._12_4_;
  auVar37._16_4_ = auVar40._16_4_ + auVar19._16_4_;
  auVar37._20_4_ = auVar40._20_4_ + auVar19._20_4_;
  auVar37._24_4_ = auVar40._24_4_ + auVar19._24_4_;
  auVar37._28_4_ = auVar40._28_4_ + auVar19._28_4_;
  auVar32 = vminps_avx512vl(auVar23,ZEXT1632(auVar49));
  auVar19 = vminps_avx512vl(auVar23,ZEXT1632(auVar15));
  auVar24 = vminps_avx512vl(auVar23,auVar40);
  auVar31 = vminps_avx(auVar20,auVar35);
  auVar22 = vminps_avx(auVar32,auVar31);
  auVar31 = vminps_avx(auVar25,auVar36);
  auVar23 = vminps_avx(auVar19,auVar31);
  auVar31 = vminps_avx(auVar26,auVar37);
  auVar24 = vminps_avx(auVar24,auVar31);
  auVar32 = vmaxps_avx512vl(auVar33,ZEXT1632(auVar49));
  auVar19 = vmaxps_avx512vl(auVar33,ZEXT1632(auVar15));
  auVar33 = vmaxps_avx512vl(auVar33,auVar40);
  auVar31 = vmaxps_avx(auVar20,auVar35);
  auVar31 = vmaxps_avx(auVar32,auVar31);
  auVar32 = vmaxps_avx(auVar25,auVar36);
  auVar32 = vmaxps_avx(auVar19,auVar32);
  auVar19 = vmaxps_avx(auVar26,auVar37);
  auVar19 = vmaxps_avx(auVar33,auVar19);
  auVar20 = vshufps_avx512vl(auVar34,auVar34,0xb1);
  auVar25 = vmaxps_avx512vl(auVar34,auVar20);
  auVar20 = vshufpd_avx(auVar25,auVar25,5);
  auVar20 = vmaxps_avx(auVar25,auVar20);
  auVar49 = vmaxps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar20 = vshufps_avx512vl(auVar28,auVar28,0xb1);
  auVar25 = vmaxps_avx512vl(auVar28,auVar20);
  auVar20 = vshufpd_avx(auVar25,auVar25,5);
  auVar20 = vmaxps_avx(auVar25,auVar20);
  auVar15 = vmaxps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar15 = vunpcklps_avx(auVar49,auVar15);
  auVar20 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar20 = vmaxps_avx(auVar29,auVar20);
  auVar25 = vshufpd_avx(auVar20,auVar20,5);
  auVar20 = vmaxps_avx(auVar20,auVar25);
  auVar49 = vmaxps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar49 = vinsertps_avx(auVar15,auVar49,0x28);
  auVar20 = vshufps_avx(auVar21,auVar21,0xb1);
  auVar20 = vminps_avx(auVar21,auVar20);
  auVar21 = vshufpd_avx(auVar20,auVar20,5);
  auVar20 = vminps_avx(auVar20,auVar21);
  auVar15 = vminps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar20 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar20 = vminps_avx(auVar30,auVar20);
  auVar21 = vshufpd_avx(auVar20,auVar20,5);
  auVar20 = vminps_avx(auVar20,auVar21);
  auVar18 = vminps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar18 = vunpcklps_avx(auVar15,auVar18);
  auVar20 = vshufps_avx512vl(auVar27,auVar27,0xb1);
  auVar21 = vminps_avx512vl(auVar27,auVar20);
  auVar20 = vshufpd_avx(auVar21,auVar21,5);
  auVar20 = vminps_avx(auVar21,auVar20);
  auVar15 = vminps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar15 = vinsertps_avx(auVar18,auVar15,0x28);
  auVar20 = vshufps_avx(auVar22,auVar22,0xb1);
  auVar20 = vminps_avx(auVar22,auVar20);
  auVar21 = vshufpd_avx(auVar20,auVar20,5);
  auVar20 = vminps_avx(auVar20,auVar21);
  auVar18 = vminps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar20 = vshufps_avx(auVar23,auVar23,0xb1);
  auVar20 = vminps_avx(auVar23,auVar20);
  auVar21 = vshufpd_avx(auVar20,auVar20,5);
  auVar20 = vminps_avx(auVar20,auVar21);
  auVar17 = vminps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar17 = vunpcklps_avx(auVar18,auVar17);
  auVar20 = vshufps_avx(auVar24,auVar24,0xb1);
  auVar20 = vminps_avx(auVar24,auVar20);
  auVar21 = vshufpd_avx(auVar20,auVar20,5);
  auVar20 = vminps_avx(auVar20,auVar21);
  auVar18 = vminps_avx(auVar20._0_16_,auVar20._16_16_);
  auVar18 = vinsertps_avx(auVar17,auVar18,0x28);
  auVar17 = vminps_avx(auVar15,auVar18);
  auVar20 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar31 = vmaxps_avx(auVar31,auVar20);
  auVar20 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vmaxps_avx(auVar31,auVar20);
  auVar15 = vmaxps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar31 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar31 = vmaxps_avx(auVar32,auVar31);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vmaxps_avx(auVar31,auVar32);
  auVar18 = vmaxps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar18 = vunpcklps_avx(auVar15,auVar18);
  auVar31 = vshufps_avx(auVar19,auVar19,0xb1);
  auVar31 = vmaxps_avx(auVar19,auVar31);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vmaxps_avx(auVar31,auVar32);
  auVar15 = vmaxps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar15 = vinsertps_avx(auVar18,auVar15,0x28);
  auVar18 = vmaxps_avx(auVar49,auVar15);
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar49 = vandps_avx(auVar17,auVar15);
  auVar15 = vandps_avx(auVar18,auVar15);
  auVar49 = vmaxps_avx(auVar49,auVar15);
  auVar15 = vmovshdup_avx(auVar49);
  auVar15 = vmaxss_avx(auVar15,auVar49);
  auVar49 = vshufpd_avx(auVar49,auVar49,1);
  auVar49 = vmaxss_avx(auVar49,auVar15);
  fVar72 = auVar49._0_4_ * 4.7683716e-07;
  auVar49._4_4_ = fVar72;
  auVar49._0_4_ = fVar72;
  auVar49._8_4_ = fVar72;
  auVar49._12_4_ = fVar72;
  aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar17,auVar49);
  (__return_storage_ptr__->lower).field_0 = aVar7;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar18._0_4_ + fVar72;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar18._4_4_ + fVar72;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar18._8_4_ + fVar72;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar18._12_4_ + fVar72;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }